

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_switch.cpp
# Opt level: O3

int main(void)

{
  undefined1 *puVar1;
  char *pcVar2;
  size_type sVar3;
  _Storage<const_char_*,_true> _Var4;
  ostream *poVar5;
  long *plVar6;
  ulong *puVar7;
  Color in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> empty;
  undefined1 local_90 [24];
  undefined3 uStack_78;
  undefined5 uStack_75;
  bool local_70;
  ulong *local_68;
  long local_60;
  ulong local_58;
  long lStack_50;
  _Storage<const_char_*,_true> local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  magic_enum::
  enum_switch<magic_enum::detail::default_result_type,Color,(magic_enum::detail::enum_subtype)0,main::__0&,void>
            ((anon_class_1_0_00000001 *)0x0,in_ESI);
  magic_enum::
  enum_switch<magic_enum::detail::default_result_type,Color,(magic_enum::detail::enum_subtype)0,main::__0&,void>
            ((anon_class_1_0_00000001 *)0x2,in_ESI);
  magic_enum::
  enum_switch<magic_enum::detail::default_result_type,Color,(magic_enum::detail::enum_subtype)0,overloaded<main::__1,main::__2>&,void>
            ((overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:60:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:63:5)>
              *)0x1,in_ESI);
  magic_enum::
  enum_switch<magic_enum::detail::default_result_type,Color,(magic_enum::detail::enum_subtype)0,overloaded<main::__1,main::__2>&,void>
            ((overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:60:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_example_example_switch_cpp:63:5)>
              *)0x0,in_ESI);
  puVar1 = local_90 + 0x10;
  local_68 = (ulong *)0x1a;
  local_90._0_8_ = puVar1;
  local_90._0_8_ = std::__cxx11::string::_M_create((ulong *)local_90,(ulong)&local_68);
  local_90._16_8_ = local_68;
  builtin_strncpy((char *)local_90._0_8_,"called with green argument",0x1a);
  local_90._8_8_ = local_68;
  *(char *)(local_90._0_8_ + (long)local_68) = '\0';
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_90._0_8_,(long)local_68);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((undefined1 *)local_90._0_8_ != puVar1) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  local_90._16_4_ = 0x444552;
  local_90._8_8_ = 3;
  local_90._0_8_ = puVar1;
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x102030);
  puVar7 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar7) {
    local_58 = *puVar7;
    lStack_50 = plVar6[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *puVar7;
    local_68 = (ulong *)*plVar6;
  }
  local_60 = plVar6[1];
  *plVar6 = (long)puVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((undefined1 *)local_90._0_8_ != puVar1) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_68,local_60);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  local_60 = 0;
  local_58 = local_58 & 0xffffffffffffff00;
  local_68 = &local_58;
  local_48._M_value = (char *)&local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"unrecognized","");
  sVar3 = local_40;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_value == &local_38) {
    _uStack_78 = local_38._8_8_;
    local_48 = (_Storage<const_char_*,_true>)puVar1;
  }
  local_90._17_7_ = local_38._M_allocated_capacity._1_7_;
  local_90[0x10] = local_38._M_local_buf[0];
  local_90._8_8_ = local_40;
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_90._0_8_ = local_48;
  _Var4 = local_48;
  local_48._M_value = (char *)&local_38;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,_Var4._M_value,sVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((undefined1 *)local_90._0_8_ != puVar1) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_value != &local_38) {
    operator_delete(local_48._M_value,
                    CONCAT71(local_38._M_allocated_capacity._1_7_,local_38._M_local_buf[0]) + 1);
  }
  *(uint *)(std::ostream::_M_insert<bool> + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ostream::_M_insert<bool> + *(long *)(std::cout + -0x18)) | 1;
  local_48._M_value = "cica";
  local_40 = CONCAT71(local_40._1_7_,1);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<const_char_*,_true>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_90,(optional<const_char_*> *)&local_48);
  if (local_70 == false) {
    std::__throw_bad_optional_access();
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_90._0_8_,local_90._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((local_70 == true) && (local_70 = false, (undefined1 *)local_90._0_8_ != local_90 + 0x10)) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  pcVar2 = local_90 + 0x10;
  local_90._16_8_ = 0x7573657220646572;
  local_90._8_8_ = 10;
  uStack_78 = 0x746c;
  local_70 = true;
  local_90._0_8_ = pcVar2;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((local_70 == true) && (local_70 = false, (char *)local_90._0_8_ != pcVar2)) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  poVar5 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  return 0;
}

Assistant:

int main() {
  Color c = Color::RED;

  auto lambda = [] (auto value) {
    std::cout << DoWork<value>() << std::endl;
  };

  magic_enum::enum_switch(lambda, c); // prints "default"

  c = Color::GREEN;

  magic_enum::enum_switch(lambda, c); // prints "override"

  // with object, explicit enum type
  auto switcher1 = overloaded{
    [] (magic_enum::enum_constant<Color::BLUE>) {
      std::cout << "Blue" << std::endl;
    },
    [] (magic_enum::enum_constant<Color::RED>) {
      std::cout << "Red" << std::endl;
    }
  };

  magic_enum::enum_switch(switcher1, Color::GREEN); // prints nothing
  magic_enum::enum_switch(switcher1, Color::BLUE); // prints "Blue"
  magic_enum::enum_switch(switcher1, Color::RED); // prints "Red"

  // explicit result type
  auto switcher2 = overloaded{
    [] (magic_enum::enum_constant<Color::GREEN>) {
      return "called with green argument";
    },
    [] (Color other) { // default case
      auto name = magic_enum::enum_name(other); // not empty
      return "default: " + std::string{name};
    }
  };

  std::cout << magic_enum::enum_switch<std::string>(switcher2, Color::GREEN) << std::endl; // prints "called with green argument"
  std::cout << magic_enum::enum_switch<std::string>(switcher2, Color::RED) << std::endl; // prints "default: RED"

  auto empty = magic_enum::enum_switch<std::string>(switcher2, static_cast<Color>(-3)); // returns an empty string
  assert(empty.empty());

  // result with default object
  std::cout << magic_enum::enum_switch<std::string>(switcher2, static_cast<Color>(-3), "unrecognized") << std::endl; // prints "unrecognized"

  auto switcher3 = overloaded{
    [] (magic_enum::enum_constant<Color::RED>) -> std::optional<std::string> {
      return "red result";
    },
    [] (magic_enum::enum_constant<Color::BLUE>) -> std::optional<std::string> {
      return std::nullopt;
    }
  };

  std::cout << std::boolalpha;
  std::cout << magic_enum::enum_switch(switcher3, Color::GREEN, std::make_optional("cica")).value() << std::endl; // prints default: "cica"
  std::cout << magic_enum::enum_switch(switcher3, Color::RED, std::make_optional("cica")).value() << std::endl; // prints: "red result"
  std::cout << magic_enum::enum_switch(switcher3, Color::BLUE, std::make_optional("cica")).has_value() << std::endl; // prints: false

  return 0;
}